

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkHandleFailure(ARKodeMem ark_mem,int flag)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  sunrealtype sVar4;
  sunrealtype sVar5;
  
  switch(flag) {
  case -0x2e:
    pcVar3 = "The relaxation Jacobian failed unrecoverably";
    iVar2 = -0x2e;
    iVar1 = 0xa77;
    goto LAB_00150a96;
  case -0x2d:
    pcVar3 = "The relaxation function failed unrecoverably";
    iVar2 = -0x2d;
    iVar1 = 0xa73;
    goto LAB_00150a96;
  case -0x2c:
    pcVar3 = "The ARKODE relaxation module memory is NULL";
    iVar2 = -0x2c;
    iVar1 = 0xa6f;
    goto LAB_00150a96;
  case -0x2b:
    pcVar3 = "At t = %Lg the relaxation module failed";
    iVar2 = -0x2b;
    iVar1 = 0xa6a;
    goto LAB_00150a96;
  default:
    pcVar3 = 
    "ARKODE encountered an unrecognized error. Please report this to the Sundials developers at sundials-users@llnl.gov"
    ;
    flag = -99;
    iVar2 = -99;
    iVar1 = 0xa7c;
    goto LAB_00150a96;
  case -0x29:
    pcVar3 = "ARKODE was provided an invalid method table";
    iVar2 = -0x29;
    iVar1 = 0xa66;
    goto LAB_00150a96;
  case -0x28:
    pcVar3 = "At t = %Lg the interpolation module failed unrecoverably";
    iVar2 = -0x28;
    iVar1 = 0xa61;
    goto LAB_00150a96;
  case -0x27:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %lg the user-supplied predictor failed in an unrecoverable manner.";
    iVar2 = -0x27;
    iVar1 = 0xa55;
    break;
  case -0x26:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %lg, the stage postprocessing routine failed in an unrecoverable manner.";
    iVar2 = -0x26;
    iVar1 = 0xa5d;
    break;
  case -0x25:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %lg, the step postprocessing routine failed in an unrecoverable manner.";
    iVar2 = -0x25;
    iVar1 = 0xa59;
    break;
  case -0x22:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %lg, the inner stepper failed in an unrecoverable manner.";
    iVar2 = -0x22;
    iVar1 = 0xa4d;
    break;
  case -0x20:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %lg the nonlinear solver failed in an unrecoverable manner.";
    iVar2 = -0x20;
    iVar1 = 0xa51;
    break;
  case -0x1e:
    pcVar3 = "At t = %Lg the nonlinear solver setup failed unrecoverably";
    iVar2 = -0x1e;
    iVar1 = 0xa44;
    goto LAB_00150a96;
  case -0x1c:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %lg, a vector operation failed.";
    iVar2 = -0x1c;
    iVar1 = 0xa49;
    break;
  case -0x1b:
    pcVar3 = "tout too close to t0 to start integration.";
    iVar2 = -0x1b;
    iVar1 = 0xa38;
    goto LAB_00150a96;
  case -0x13:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %lg, unable to satisfy inequality constraints.";
    iVar2 = -0x13;
    iVar1 = 0xa3c;
    break;
  case -0x10:
    pcVar3 = "The mass matrix solver failed.";
    iVar2 = -0x10;
    iVar1 = 0xa40;
LAB_00150a96:
    arkProcessError(ark_mem,iVar2,iVar1,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,pcVar3);
    return flag;
  case -0xc:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %lg, the rootfinding routine failed in an unrecoverable manner.";
    iVar2 = -0xc;
    iVar1 = 0xa34;
    break;
  case -0xb:
    sVar5 = ark_mem->tcur;
    pcVar3 = 
    "At t = %lg, the right-hand side failed in a recoverable manner, but no recovery is possible.";
    iVar2 = -0xb;
    iVar1 = 0xa2c;
    break;
  case -10:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %lg repeated recoverable right-hand side function errors.";
    iVar2 = -10;
    iVar1 = 0xa30;
    break;
  case -8:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %lg, the right-hand side routine failed in an unrecoverable manner.";
    iVar2 = -8;
    iVar1 = 0xa28;
    break;
  case -7:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %lg, the solve routine failed in an unrecoverable manner.";
    iVar2 = -7;
    iVar1 = 0xa24;
    break;
  case -6:
    sVar5 = ark_mem->tcur;
    pcVar3 = "At t = %lg, the setup routine failed in an unrecoverable manner.";
    iVar2 = -6;
    iVar1 = 0xa20;
    break;
  case -4:
    sVar5 = ark_mem->h;
    sVar4 = ark_mem->tcur;
    pcVar3 = 
    "At t = %lg and h = %lg, the solver convergence test failed repeatedly or with |h| = hmin.";
    iVar2 = -4;
    iVar1 = 0xa1c;
    goto LAB_0015079c;
  case -3:
    sVar5 = ark_mem->h;
    sVar4 = ark_mem->tcur;
    pcVar3 = "At t = %lg and h = %lg, the error test failed repeatedly or with |h| = hmin.";
    iVar2 = -3;
    iVar1 = 0xa18;
LAB_0015079c:
    arkProcessError(ark_mem,iVar2,iVar1,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,pcVar3,sVar4,sVar5);
    return flag;
  }
  arkProcessError(ark_mem,iVar2,iVar1,"arkHandleFailure",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                  ,pcVar3,sVar5);
  return flag;
}

Assistant:

int arkHandleFailure(ARKodeMem ark_mem, int flag)
{
  /* Depending on flag, print error message and return error flag */
  switch (flag)
  {
  case ARK_ERR_FAILURE:
    arkProcessError(ark_mem, ARK_ERR_FAILURE, __LINE__, __func__, __FILE__,
                    MSG_ARK_ERR_FAILS, ark_mem->tcur, ark_mem->h);
    break;
  case ARK_CONV_FAILURE:
    arkProcessError(ark_mem, ARK_CONV_FAILURE, __LINE__, __func__, __FILE__,
                    MSG_ARK_CONV_FAILS, ark_mem->tcur, ark_mem->h);
    break;
  case ARK_LSETUP_FAIL:
    arkProcessError(ark_mem, ARK_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_SETUP_FAILED, ark_mem->tcur);
    break;
  case ARK_LSOLVE_FAIL:
    arkProcessError(ark_mem, ARK_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_SOLVE_FAILED, ark_mem->tcur);
    break;
  case ARK_RHSFUNC_FAIL:
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_RHSFUNC_FAILED, ark_mem->tcur);
    break;
  case ARK_UNREC_RHSFUNC_ERR:
    arkProcessError(ark_mem, ARK_UNREC_RHSFUNC_ERR, __LINE__, __func__,
                    __FILE__, MSG_ARK_RHSFUNC_UNREC, ark_mem->tcur);
    break;
  case ARK_REPTD_RHSFUNC_ERR:
    arkProcessError(ark_mem, ARK_REPTD_RHSFUNC_ERR, __LINE__, __func__,
                    __FILE__, MSG_ARK_RHSFUNC_REPTD, ark_mem->tcur);
    break;
  case ARK_RTFUNC_FAIL:
    arkProcessError(ark_mem, ARK_RTFUNC_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_RTFUNC_FAILED, ark_mem->tcur);
    break;
  case ARK_TOO_CLOSE:
    arkProcessError(ark_mem, ARK_TOO_CLOSE, __LINE__, __func__, __FILE__,
                    MSG_ARK_TOO_CLOSE);
    break;
  case ARK_CONSTR_FAIL:
    arkProcessError(ark_mem, ARK_CONSTR_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_FAILED_CONSTR, ark_mem->tcur);
    break;
  case ARK_MASSSOLVE_FAIL:
    arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MASSSOLVE_FAIL);
    break;
  case ARK_NLS_SETUP_FAIL:
    arkProcessError(ark_mem, ARK_NLS_SETUP_FAIL, __LINE__, __func__,
                    __FILE__, "At t = %Lg the nonlinear solver setup failed unrecoverably",
                    (long double)ark_mem->tcur);
    break;
  case ARK_VECTOROP_ERR:
    arkProcessError(ark_mem, ARK_VECTOROP_ERR, __LINE__, __func__, __FILE__,
                    MSG_ARK_VECTOROP_ERR, ark_mem->tcur);
    break;
  case ARK_INNERSTEP_FAIL:
    arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_INNERSTEP_FAILED, ark_mem->tcur);
    break;
  case ARK_NLS_OP_ERR:
    arkProcessError(ark_mem, ARK_NLS_OP_ERR, __LINE__, __func__, __FILE__,
                    MSG_ARK_NLS_FAIL, ark_mem->tcur);
    break;
  case ARK_USER_PREDICT_FAIL:
    arkProcessError(ark_mem, ARK_USER_PREDICT_FAIL, __LINE__, __func__,
                    __FILE__, MSG_ARK_USER_PREDICT_FAIL, ark_mem->tcur);
    break;
  case ARK_POSTPROCESS_STEP_FAIL:
    arkProcessError(ark_mem, ARK_POSTPROCESS_STEP_FAIL, __LINE__, __func__,
                    __FILE__, MSG_ARK_POSTPROCESS_STEP_FAIL, ark_mem->tcur);
    break;
  case ARK_POSTPROCESS_STAGE_FAIL:
    arkProcessError(ark_mem, ARK_POSTPROCESS_STAGE_FAIL, __LINE__, __func__,
                    __FILE__, MSG_ARK_POSTPROCESS_STAGE_FAIL, ark_mem->tcur);
    break;
  case ARK_INTERP_FAIL:
    arkProcessError(ark_mem, ARK_INTERP_FAIL, __LINE__, __func__, __FILE__,
                    "At t = %Lg the interpolation module failed unrecoverably",
                    (long double)ark_mem->tcur);
    break;
  case ARK_INVALID_TABLE:
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "ARKODE was provided an invalid method table");
    break;
  case ARK_RELAX_FAIL:
    arkProcessError(ark_mem, ARK_RELAX_FAIL, __LINE__, __func__, __FILE__,
                    "At t = %Lg the relaxation module failed",
                    (long double)ark_mem->tcur);
    break;
  case ARK_RELAX_MEM_NULL:
    arkProcessError(ark_mem, ARK_RELAX_MEM_NULL, __LINE__, __func__, __FILE__,
                    "The ARKODE relaxation module memory is NULL");
    break;
  case ARK_RELAX_FUNC_FAIL:
    arkProcessError(ark_mem, ARK_RELAX_FUNC_FAIL, __LINE__, __func__, __FILE__,
                    "The relaxation function failed unrecoverably");
    break;
  case ARK_RELAX_JAC_FAIL:
    arkProcessError(ark_mem, ARK_RELAX_JAC_FAIL, __LINE__, __func__, __FILE__,
                    "The relaxation Jacobian failed unrecoverably");
    break;
  default:
    /* This return should never happen */
    arkProcessError(ark_mem, ARK_UNRECOGNIZED_ERROR, __LINE__, __func__, __FILE__,
                    "ARKODE encountered an unrecognized error. Please report "
                    "this to the Sundials developers at "
                    "sundials-users@llnl.gov");
    return (ARK_UNRECOGNIZED_ERROR);
  }

  return (flag);
}